

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a09b5::Handlers::beginOverlay(Handlers *this,JSON *j)

{
  __shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  QPDFJob::Config::overlay((Config *)&_Stack_28);
  std::__shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  beginUnderOverlay(this,j);
  return;
}

Assistant:

void
Handlers::beginOverlay(JSON j)
{
    this->c_uo = c_main->overlay();
    beginUnderOverlay(j);
}